

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall kj::str<unsigned_int&>(String *__return_storage_ptr__,kj *this,uint *params)

{
  String *result;
  char *__dest;
  CappedArray<char,_14UL> local_28;
  
  _::Stringifier::operator*(&local_28,(Stringifier *)&_::STR,*(uint *)this);
  heapString(__return_storage_ptr__,local_28.currentSize);
  if (local_28.currentSize != 0) {
    __dest = (char *)(__return_storage_ptr__->content).size_;
    if (__dest != (char *)0x0) {
      __dest = (__return_storage_ptr__->content).ptr;
    }
    memcpy(__dest,local_28.content,local_28.currentSize);
  }
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}